

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak_internal.hpp
# Opt level: O3

bool adiak::internal::parse<adiak::catstring>::make_value
               (catstring *obj,adiak_value_t *val,adiak_datatype_t *param_3)

{
  pointer pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *local_38 [2];
  char local_28 [16];
  
  pcVar1 = (obj->v)._M_dataplus._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,pcVar1 + (obj->v)._M_string_length);
  pcVar2 = local_38[0];
  pcVar3 = strdup(local_38[0]);
  val->v_ptr = pcVar3;
  if (pcVar2 != local_28) {
    operator_delete(pcVar2);
  }
  return true;
}

Assistant:

static bool make_value(T &obj, adiak_value_t *val, adiak_datatype_t *) {
            element_type<T>::set(*val, obj);
            return true;
         }